

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O0

void bson_meta(lua_State *L)

{
  int iVar1;
  undefined1 local_48 [8];
  luaL_Reg l [3];
  lua_State *L_local;
  
  iVar1 = luaL_newmetatable(L,"bson");
  if (iVar1 != 0) {
    memcpy(local_48,&DAT_00184680,0x30);
    luaL_checkversion_(L,503.0,0x88);
    lua_createtable(L,0,2);
    luaL_setfuncs(L,(luaL_Reg *)local_48,0);
    lua_setfield(L,-2,"__index");
    lua_pushcclosure(L,ltostring,0);
    lua_setfield(L,-2,"__tostring");
    lua_pushcclosure(L,llen,0);
    lua_setfield(L,-2,"__len");
    lua_pushcclosure(L,lreplace,0);
    lua_setfield(L,-2,"__newindex");
  }
  lua_setmetatable(L,-2);
  return;
}

Assistant:

static void
bson_meta(lua_State *L) {
	if (luaL_newmetatable(L, "bson")) {
		luaL_Reg l[] = {
			{ "decode", ldecode },
			{ "makeindex", lmakeindex },
			{ NULL, NULL },
		};
		luaL_newlib(L,l);
		lua_setfield(L, -2, "__index");
		lua_pushcfunction(L, ltostring);
		lua_setfield(L, -2, "__tostring");
		lua_pushcfunction(L, llen);
		lua_setfield(L, -2, "__len");
		lua_pushcfunction(L, lreplace);
		lua_setfield(L, -2, "__newindex");
	}
	lua_setmetatable(L, -2);
}